

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<cs_impl::any,cs_impl::any>::
     transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               (allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *alloc,slot_type *new_slot,
               slot_type *old_slot)

{
  slot_type *in_RDX;
  allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *in_RSI;
  
  map_slot_policy<cs_impl::any,_cs_impl::any>::emplace((slot_type *)0x47148c);
  allocator_traits<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>::
  construct<std::pair<cs_impl::any,cs_impl::any>,std::pair<cs_impl::any,cs_impl::any>>
            (in_RSI,(pair<cs_impl::any,_cs_impl::any> *)&in_RDX->value,
             (pair<cs_impl::any,_cs_impl::any> *)0x47149f);
  destroy<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>(in_RSI,in_RDX);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}